

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  ;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }